

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O0

void __thiscall kratos::HashVisitor::visit(HashVisitor *this,CombinationalStmtBlock *param_1)

{
  unsigned_long local_28 [2];
  uint64_t comb_signature;
  CombinationalStmtBlock *param_1_local;
  HashVisitor *this_local;
  
  local_28[1] = 0xf1bbcdcbfa53e0b4;
  local_28[0] = -0xe44323405ac1f4c << ((byte)(this->super_IRVisitor).level & 0x3f);
  comb_signature = (uint64_t)param_1;
  param_1_local = (CombinationalStmtBlock *)this;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->stmt_hashes_,local_28);
  return;
}

Assistant:

void visit(CombinationalStmtBlock*) override {
        constexpr uint64_t comb_signature = shift_const(0x9e3779b97f4a7c16, 3);
        stmt_hashes_.emplace_back(comb_signature << level);
    }